

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O3

lws * lws_create_adopt_udp
                (lws_vhost *vhost,char *ads,int port,int flags,char *protocol_name,char *ifname,
                lws *parent_wsi,void *opaque,lws_retry_bo_t *retry_policy)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  lws_sock_file_fd_type fd;
  lws *plVar5;
  char *pcVar6;
  addrinfo *paVar7;
  ulong uVar8;
  uint *puVar9;
  int __protocol;
  undefined4 local_94;
  ulong local_90;
  char *local_88;
  addrinfo *r;
  char buf [16];
  addrinfo local_68;
  
  local_88 = "null";
  if (ads != (char *)0x0) {
    local_88 = ads;
  }
  _lws_log(8,"%s: %s:%u\n","lws_create_adopt_udp",local_88,(ulong)(uint)port);
  plVar5 = lws_adopt_descriptor_vhost1
                     (vhost,LWS_ADOPT_RAW_SOCKET_UDP,protocol_name,parent_wsi,opaque);
  if (plVar5 == (lws *)0x0) {
    _lws_log(1,"%s: udp wsi creation failed\n","lws_create_adopt_udp");
  }
  else {
    *(ulong *)&plVar5->field_0x2dc =
         (ulong)((flags & 4U) << 7) |
         (ulong)((flags & 2U) << 9) |
         *(ulong *)&plVar5->field_0x2dc & 0xffffff7ffffff9ff | (ulong)(flags & 1) << 0x27;
    plVar5->c_port = (uint16_t)port;
    if (retry_policy == (lws_retry_bo_t *)0x0) {
      retry_policy = vhost->retry_policy;
    }
    plVar5->retry_policy = retry_policy;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_socktype = 2;
    local_68.ai_protocol = 0x11;
    local_68.ai_flags = 0x21;
    local_68.ai_family = 0;
    lws_snprintf(buf,0x10,"%u",(ulong)(uint)port);
    iVar4 = getaddrinfo(ads,buf,&local_68,(addrinfo **)&r);
    if (iVar4 == 0) {
      local_94 = 1;
      if (plVar5->dns_results == (addrinfo *)0x0) {
        plVar5->dns_results = r;
        plVar5->dns_results_next = r;
      }
      if (ads == (char *)0x0 || r != (addrinfo *)0x0) {
        paVar7 = plVar5->dns_results_next;
        if (paVar7 != (addrinfo *)0x0) {
          local_90 = 0x8000000200;
          do {
            if ((plVar5->field_0x2dd & 2) == 0) {
              iVar4 = paVar7->ai_family;
              __protocol = 0x11;
            }
            else {
              __protocol = 8;
              iVar4 = 0x11;
            }
            fd.sockfd = socket(iVar4,2,__protocol);
            if (fd.sockfd != -1) {
              *(uint16_t *)plVar5->dns_results_next->ai_addr->sa_data =
                   plVar5->c_port << 8 | plVar5->c_port >> 8;
              iVar4 = setsockopt(fd.sockfd,1,2,&local_94,4);
              if (iVar4 < 0) {
                _lws_log(1,"%s: failed to set reuse\n","lws_create_adopt_udp2");
              }
              if (((plVar5->field_0x2dd & 4) != 0) &&
                 (iVar4 = setsockopt(fd.sockfd,1,6,&local_94,4), iVar4 < 0)) {
                _lws_log(1,"%s: failed to set broadcast\n","lws_create_adopt_udp2");
              }
              uVar8 = *(ulong *)&plVar5->field_0x2dc;
              if ((uVar8 & 0x8000000000) != 0) {
                iVar4 = bind(fd.sockfd,(sockaddr *)plVar5->dns_results_next->ai_addr,0x10);
                if (iVar4 == -1) {
                  _lws_log(1,"%s: bind failed\n","lws_create_adopt_udp2");
                  goto LAB_00139612;
                }
                uVar8 = *(ulong *)&plVar5->field_0x2dc;
              }
              if ((local_90 & uVar8) != 0) {
LAB_001396c8:
                lws_addrinfo_clean(plVar5);
                plVar5 = lws_adopt_descriptor_vhost2(plVar5,LWS_ADOPT_RAW_SOCKET_UDP,fd);
                return plVar5;
              }
              iVar4 = connect(fd.sockfd,(sockaddr *)plVar5->dns_results_next->ai_addr,
                              plVar5->dns_results_next->ai_addrlen);
              if (iVar4 != -1) {
                memcpy(plVar5->udp,plVar5->dns_results_next->ai_addr,
                       (ulong)plVar5->dns_results_next->ai_addrlen);
                plVar5->udp->salen = plVar5->dns_results_next->ai_addrlen;
                goto LAB_001396c8;
              }
              uVar1 = plVar5->dns_results_next->ai_addr->sa_family;
              uVar2 = plVar5->c_port;
              uVar3 = plVar5->dns_results_next->ai_addrlen;
              puVar9 = (uint *)__errno_location();
              _lws_log(1,"%s: conn fd %d fam %d %s:%u failed (salen %d) errno %d\n",
                       "lws_create_adopt_udp2",(ulong)(uint)fd.sockfd,(ulong)uVar1,local_88,
                       (ulong)uVar2,(ulong)uVar3,(ulong)*puVar9);
              close(fd.sockfd);
            }
LAB_00139612:
            paVar7 = plVar5->dns_results_next->ai_next;
            plVar5->dns_results_next = paVar7;
          } while (paVar7 != (addrinfo *)0x0);
        }
        puVar9 = (uint *)__errno_location();
        _lws_log(1,"%s: unable to create INET socket %d\n","lws_create_adopt_udp2",(ulong)*puVar9);
        lws_addrinfo_clean(plVar5);
      }
      else {
        _lws_log(4,"%s: bad: n %d, r %p\n","lws_create_adopt_udp2",0,0);
        plVar5->dns_results = (addrinfo *)0x0;
        plVar5->dns_results_next = (addrinfo *)0x0;
      }
    }
    else {
      pcVar6 = gai_strerror(iVar4);
      _lws_log(8,"%s: getaddrinfo error: %s\n","lws_create_adopt_udp",pcVar6);
    }
    lws_close_free_wsi(plVar5,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_create_adopt_udp(struct lws_vhost *vhost, const char *ads, int port,
		     int flags, const char *protocol_name, const char *ifname,
		     struct lws *parent_wsi, void *opaque,
		     const lws_retry_bo_t *retry_policy)
{
#if !defined(LWS_PLAT_OPTEE)
	struct lws *wsi;
	int n;

	lwsl_info("%s: %s:%u\n", __func__, ads ? ads : "null", port);

	/* create the logical wsi without any valid fd */

	wsi = lws_adopt_descriptor_vhost1(vhost, LWS_ADOPT_RAW_SOCKET_UDP,
					  protocol_name, parent_wsi, opaque);
	if (!wsi) {
		lwsl_err("%s: udp wsi creation failed\n", __func__);
		goto bail;
	}
	wsi->do_bind = !!(flags & LWS_CAUDP_BIND);
	wsi->do_broadcast = !!(flags & LWS_CAUDP_BROADCAST);
	wsi->pf_packet = !!(flags & LWS_CAUDP_PF_PACKET);
	wsi->c_port = port;
	if (retry_policy)
		wsi->retry_policy = retry_policy;
	else
		wsi->retry_policy = vhost->retry_policy;

#if !defined(LWS_WITH_SYS_ASYNC_DNS)
	{
		struct addrinfo *r, h;
		char buf[16];

		memset(&h, 0, sizeof(h));
		h.ai_family = AF_UNSPEC;    /* Allow IPv4 or IPv6 */
		h.ai_socktype = SOCK_DGRAM;
		h.ai_protocol = IPPROTO_UDP;
		h.ai_flags = AI_PASSIVE;
#ifdef AI_ADDRCONFIG
		h.ai_flags |= AI_ADDRCONFIG;
#endif

		/* if the dns lookup is synchronous, do the whole thing now */
		lws_snprintf(buf, sizeof(buf), "%u", port);
		n = getaddrinfo(ads, buf, &h, &r);
		if (n) {
#if !defined(LWS_PLAT_FREERTOS)
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
				  gai_strerror(n));
#else
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
					strerror(n));
#endif
			//freeaddrinfo(r);
			goto bail1;
		}
		/* complete it immediately after the blocking dns lookup
		 * finished... free r when connect either completed or failed */
		wsi = lws_create_adopt_udp2(wsi, ads, r, 0, NULL);

		return wsi;
	}
#else
	if (ads) {
		/*
		 * with async dns, use the wsi as the point about which to do
		 * the dns lookup and have it call the second part when it's
		 * done.
		 *
		 * Keep a refcount on the results and free it when we connected
		 * or definitively failed.
		 *
		 * Notice wsi has no socket at this point (we don't know what
		 * kind to ask for until we get the dns back).  But it is bound
		 * to a vhost and can be cleaned up from that at vhost destroy.
		 */
		n = lws_async_dns_query(vhost->context, 0, ads,
					LWS_ADNS_RECORD_A,
					lws_create_adopt_udp2, wsi, (void *)ifname);
		lwsl_debug("%s: dns query returned %d\n", __func__, n);
		if (n == LADNS_RET_FAILED) {
			lwsl_err("%s: async dns failed\n", __func__);
			wsi = NULL;
			/*
			 * It was already closed by calling callback with error
			 * from lws_async_dns_query()
			 */
			goto bail;
		}
	} else {
		lwsl_debug("%s: udp adopt has no ads\n", __func__);
		wsi = lws_create_adopt_udp2(wsi, ads, NULL, 0, (void *)ifname);
	}

	/* dns lookup is happening asynchronously */

	lwsl_debug("%s: returning wsi %p\n", __func__, wsi);
	return wsi;
#endif
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
bail1:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "adopt udp2 fail");
	wsi = NULL;
#endif
bail:
	return wsi;
#else
	return NULL;
#endif
}